

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTCTEDataPassThrough::initTest(TessellationShaderTCTEDataPassThrough *this)

{
  _tessellation_primitive_mode primitive_mode;
  bool should_pass_point_size_data_in_ts;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  NotSupportedError *this_01;
  long lVar3;
  bool bVar4;
  _run run;
  undefined1 local_f8 [200];
  Functions *gl;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_f8);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  this_00 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_00,gl,&this->super_TestCaseBase);
  this->m_utils_ptr = this_00;
  (*gl->genVertexArrays)(1,&this->m_vao_id);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xc3);
  (*gl->bindVertexArray)(this->m_vao_id);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xc6);
  (*gl->patchParameteri)((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glPatchParameteriEXT() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xca);
  (*gl->enable)(0x8c89);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glEnable(GL_RASTERIZER_DISCARD) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xce);
  (*gl->genBuffers)(1,&this->m_bo_id);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glGenBuffers() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd2);
  (*gl->bindBuffer)(0x8c8e,this->m_bo_id);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindBuffer() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd6);
  (*gl->bindBufferBase)(0x8c8e,0,this->m_bo_id);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindBufferBase() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd9);
  lVar3 = 0;
  do {
    primitive_mode = (&DAT_01bae2b4)[lVar3];
    iVar1 = 0;
    do {
      bVar4 = false;
      do {
        should_pass_point_size_data_in_ts = false;
        do {
          if (should_pass_point_size_data_in_ts || !bVar4) {
            local_f8._0_8_ = (pointer)0x0;
            local_f8._8_4_ = 0;
            memset(local_f8 + 0x1c,0,0xac);
            local_f8._12_4_ = 0;
            local_f8._16_4_ = 0;
            local_f8._20_4_ = 0;
            local_f8._24_4_ = TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT;
            executeTestRun(this,(_run *)local_f8,primitive_mode,iVar1 == 1,bVar4,
                           should_pass_point_size_data_in_ts);
            std::
            vector<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>
            ::push_back(&this->m_runs,(_run *)local_f8);
            _run::~_run((_run *)local_f8);
          }
        } while ((!should_pass_point_size_data_in_ts) &&
                (should_pass_point_size_data_in_ts = true,
                (this->super_TestCaseBase).m_is_tessellation_shader_point_size_supported != false));
        if (bVar4) break;
        bVar4 = true;
      } while ((this->super_TestCaseBase).m_is_geometry_shader_point_size_supported != false);
    } while (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) &&
            (bVar4 = iVar1 == 0, iVar1 = iVar1 + 1, bVar4));
    lVar3 = lVar3 + 1;
    if (lVar3 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void TessellationShaderTCTEDataPassThrough::initTest()
{
	/* The test requires EXT_tessellation_shader */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Create an Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Our program objects take a single vertex per patch */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() call failed");

	/* Disable rasterization */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed");

	/* Create a buffer object we will use for XFB */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	/* Set up XFB buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");

	/* Prepare all the runs */
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	/* Iterate over all supported primitive modes */
	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		/* If geometry shaders are supported, include a separate iteration to include them
		 * in the pipeline
		 */
		for (int n_gs_stage_usage = 0; n_gs_stage_usage < ((m_is_geometry_shader_extension_supported) ? 2 : 1);
			 ++n_gs_stage_usage)
		{
			bool use_gs_stage = (n_gs_stage_usage == 1);

			/* If geometry shaders support gl_PointSize, include a separate iteration to pass
			 * point size data as well */
			for (int n_gs_pointsize_usage = 0;
				 n_gs_pointsize_usage < ((m_is_geometry_shader_point_size_supported) ? 2 : 1); ++n_gs_pointsize_usage)
			{
				bool use_gs_pointsize_data = (n_gs_pointsize_usage == 1);

				/* If tessellation shaders support gl_PointSize, include a separate iteration to pass
				 * point size data as well */
				for (int n_ts_pointsize_usage = 0;
					 n_ts_pointsize_usage < ((m_is_tessellation_shader_point_size_supported) ? 2 : 1);
					 ++n_ts_pointsize_usage)
				{
					bool use_ts_pointsize_data = (n_ts_pointsize_usage == 1);

					/* Note: it does not make sense to try to pass gl_PointSize data
					 *       in geometry stage if tessellation stage did not provide it.
					 */
					if (!use_ts_pointsize_data && use_gs_pointsize_data)
					{
						continue;
					}

					/* Initialize test run data */
					_run run;

					executeTestRun(run, primitive_mode, use_gs_stage, use_gs_pointsize_data, use_ts_pointsize_data);

					/* Store the run for later usage */
					m_runs.push_back(run);
				} /* for (tessellation point size data usage off and on cases) */
			}	 /* for (geometry point size data usage off and on cases) */
		}		  /* for (GS stage usage) */
	}			  /* for (all primitive modes) */
}